

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNOr::gen_code(CTPNOr *this,int discard,int for_condition)

{
  int iVar1;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  CTcCodeLabel *lbl;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  uchar in_stack_ffffffffffffffdf;
  
  (**(code **)**(undefined8 **)(in_RDI + 8))(*(undefined8 **)(in_RDI + 8),0,1);
  CTcPrsNode::gen_jump_ahead(in_stack_ffffffffffffffdf);
  (**(code **)**(undefined8 **)(in_RDI + 0x10))(*(undefined8 **)(in_RDI + 0x10),in_ESI,1);
  CTcGenTarg::note_pop((CTcGenTarg *)0x27ebd5);
  CTcPrsNode::def_label_pos((CTcCodeLabel *)CONCAT44(in_ESI,in_EDX));
  if ((in_EDX == 0) &&
     ((iVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x10))(), iVar1 == 0 ||
      (iVar1 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))(), iVar1 == 0)))) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
  }
  return;
}

Assistant:

void CTPNOr::gen_code(int discard, int for_condition)
{
    CTcCodeLabel *lbl;
    
    /* 
     *   First, evaluate the left-hand side; we need the result even if
     *   we're discarding the overall expression, since we will check the
     *   result to see if we should even evaluate the right-hand side.
     *   We're using the value for a condition, so don't bother
     *   boolean-izing it.  
     */
    left_->gen_code(FALSE, TRUE);

    /* 
     *   If the left-hand side is true, there's no need to evaluate the
     *   right-hand side (and, in fact, we're not even allowed to evaluate
     *   the right-hand side because of the short-circuit logic rule).
     *   So, if the lhs is true, we want to jump around the code to
     *   evaluate the rhs, saving the 'true' result if we're not
     *   discarding the overall result. 
     */
    lbl = gen_jump_ahead(discard ? OPC_JT : OPC_JST);

    /* 
     *   Evaluate the right-hand side.  We don't need to save the result
     *   unless we need the result of the overall expression.  Generate
     *   the value as though we were going to booleanize it ourselves,
     *   since we'll do just that (hence pass for_condition = TRUE).  
     */
    right_->gen_code(discard, TRUE); 

    /*
     *   If we discarded the result, we generated a JT which explicitly
     *   popped a value.  If we didn't discard the result, we generated a
     *   JST; this may or may not pop the value.  However, if it doesn't
     *   pop the value (save on true), it will bypass the right side
     *   evaluation, and will thus "pop" that value in the sense that it
     *   will never be pushed.  So, note a pop either way.  
     */
    G_cg->note_pop();

    /* define the label for the jump over the rhs */
    def_label_pos(lbl);

    /* 
     *   If the result is not going to be used directly for a condition, we
     *   must boolean-ize the value.  This isn't necessary if both of the
     *   operands are already guaranteed to be boolean values.  
     */
    if (!for_condition && !(left_->is_bool() && right_->is_bool()))
        G_cg->write_op(OPC_BOOLIZE);
}